

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

int fts5PorterGobbleVC(char *zStem,int nStem,int bPrevCons)

{
  int iVar1;
  ulong uVar2;
  long lVar3;
  ulong uVar4;
  
  uVar2 = 0;
  uVar4 = 0;
  if (0 < nStem) {
    uVar4 = (ulong)(uint)nStem;
  }
  for (; uVar4 != uVar2; uVar2 = uVar2 + 1) {
    iVar1 = fts5PorterIsVowel(zStem[uVar2],bPrevCons);
    if (iVar1 != 0) {
      bPrevCons = 0;
      uVar4 = uVar2;
      break;
    }
    bPrevCons = 1;
  }
  lVar3 = uVar4 + 1;
  do {
    if (nStem <= lVar3) {
      lVar3 = 0;
      break;
    }
    iVar1 = fts5PorterIsVowel(zStem[lVar3],bPrevCons);
    lVar3 = lVar3 + 1;
    bPrevCons = 0;
  } while (iVar1 != 0);
  return (int)lVar3;
}

Assistant:

static int fts5PorterGobbleVC(char *zStem, int nStem, int bPrevCons){
  int i;
  int bCons = bPrevCons;

  /* Scan for a vowel */
  for(i=0; i<nStem; i++){
    if( 0==(bCons = !fts5PorterIsVowel(zStem[i], bCons)) ) break;
  }

  /* Scan for a consonent */
  for(i++; i<nStem; i++){
    if( (bCons = !fts5PorterIsVowel(zStem[i], bCons)) ) return i+1;
  }
  return 0;
}